

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O2

void __thiscall cmGlobalGenerator::FillProjectMap(cmGlobalGenerator *this)

{
  pointer ppcVar1;
  bool bVar2;
  mapped_type *this_00;
  cmLocalGenerator *pcVar3;
  uint uVar4;
  ulong uVar5;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
  ::clear(&(this->ProjectMap)._M_t);
  uVar4 = 0;
  while( true ) {
    uVar5 = (ulong)uVar4;
    ppcVar1 = (this->LocalGenerators).
              super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->LocalGenerators).
                      super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish - (long)ppcVar1 >> 3) <= uVar5)
    break;
    pcVar3 = ppcVar1[uVar5];
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    local_50._M_string_length = 0;
    local_50.field_2._M_local_buf[0] = '\0';
    do {
      bVar2 = std::operator!=(&local_50,(pcVar3->Makefile->ProjectName)._M_dataplus._M_p);
      if (bVar2) {
        std::__cxx11::string::assign((char *)&local_50);
        this_00 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>_>_>_>
                  ::operator[](&this->ProjectMap,&local_50);
        std::vector<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>::push_back
                  (this_00,(this->LocalGenerators).
                           super__Vector_base<cmLocalGenerator_*,_std::allocator<cmLocalGenerator_*>_>
                           ._M_impl.super__Vector_impl_data._M_start + uVar5);
      }
      pcVar3 = pcVar3->Parent;
    } while (pcVar3 != (cmLocalGenerator *)0x0);
    std::__cxx11::string::~string((string *)&local_50);
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

void cmGlobalGenerator::FillProjectMap()
{
  this->ProjectMap.clear(); // make sure we start with a clean map
  unsigned int i;
  for(i = 0; i < this->LocalGenerators.size(); ++i)
    {
    // for each local generator add all projects
    cmLocalGenerator *lg = this->LocalGenerators[i];
    std::string name;
    do
      {
      if (name != lg->GetMakefile()->GetProjectName())
        {
        name = lg->GetMakefile()->GetProjectName();
        this->ProjectMap[name].push_back(this->LocalGenerators[i]);
        }
      lg = lg->GetParent();
      }
    while (lg);
    }
}